

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image *
rf_image_color_brightness_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,int brightness,void *dst,rf_int dst_size)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  int iVar4;
  rf_color rVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 uVar11;
  int iVar12;
  long lVar13;
  void *dst_00;
  long lVar14;
  undefined1 local_80;
  undefined1 uStack_7f;
  undefined1 uStack_7e;
  uchar uStack_7d;
  int local_7c;
  long local_78;
  long local_70;
  void *local_68;
  rf_image *local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (image.valid == true) {
    local_78 = (long)image.width;
    local_70 = (long)image.height;
    iVar4 = rf_bits_per_pixel(image.format);
    iVar4 = iVar4 * image.height * image.width;
    iVar7 = iVar4 + 7;
    if (-1 < iVar4) {
      iVar7 = iVar4;
    }
    if (iVar7 >> 3 <= dst_size) {
      iVar7 = -0xff;
      if (-0xff < brightness) {
        iVar7 = brightness;
      }
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      if (image.format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
        local_40 = *(long *)(&DAT_0017bfa8 + (ulong)(image.format - RF_UNCOMPRESSED_GRAYSCALE) * 8);
      }
      else {
        local_40 = 0;
      }
      local_68 = dst;
      local_60 = __return_storage_ptr__;
      if (0 < (int)local_70) {
        local_58 = local_40 * local_78;
        lVar13 = 0;
        local_50 = 0;
        local_7c = iVar7;
        local_38 = (ulong)image.format;
        do {
          lVar14 = local_78;
          local_48 = lVar13;
          if (0 < (int)local_78) {
            do {
              dst_00 = (void *)((lVar13 >> 0x20) + (long)local_68);
              rVar5 = rf_format_one_pixel_to_rgba32
                                ((void *)((long)image.data + (lVar13 >> 0x20)),image.format);
              iVar6 = ((uint)rVar5 & 0xff) + iVar7;
              iVar8 = ((uint)rVar5 >> 8 & 0xff) + iVar7;
              iVar9 = ((uint)rVar5 >> 0x10 & 0xff) + iVar7;
              iVar4 = 0xff;
              if (iVar6 < 0xff) {
                iVar4 = iVar6;
              }
              iVar10 = 0xff;
              if (iVar8 < 0xff) {
                iVar10 = iVar8;
              }
              iVar12 = 0xff;
              if (iVar9 < 0xff) {
                iVar12 = iVar9;
              }
              uVar1 = (char)iVar4;
              if (iVar6 < 0) {
                uVar1 = 1;
              }
              uVar2 = (char)iVar10;
              if (iVar8 < 0) {
                uVar2 = 1;
              }
              uVar11 = (undefined1)iVar12;
              if (iVar9 < 0) {
                uVar11 = 1;
              }
              uStack_7d = rVar5.a;
              _local_80 = CONCAT12(uVar11,CONCAT11(uVar2,uVar1));
              rf_format_one_pixel(&local_80,RF_UNCOMPRESSED_R8G8B8A8,dst_00,image.format);
              lVar13 = lVar13 + local_40;
              lVar14 = lVar14 + -1;
            } while (lVar14 != 0);
          }
          local_50 = local_50 + 1;
          lVar13 = local_48 + local_58;
        } while (local_50 != local_70);
      }
      local_60->data = image.data;
      local_60->width = (int)image._8_8_;
      local_60->height = (int)((ulong)image._8_8_ >> 0x20);
      uVar3 = image._16_8_;
      local_60->format = (int)uVar3;
      local_60->valid = (_Bool)(char)((ulong)uVar3 >> 0x20);
      *(int3 *)&local_60->field_0x15 = (int3)((ulong)uVar3 >> 0x28);
      local_60->data = local_68;
      __return_storage_ptr__ = local_60;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_color_brightness_to_buffer(rf_image image, int brightness, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (dst_size >= rf_image_size(image))
        {
            if (brightness < -255) brightness = -255;
            if (brightness > +255) brightness = +255;

            int bpp = rf_bytes_per_pixel(image.format);

            for (rf_int y = 0; y < image.height; y++)
            {
                for (rf_int x = 0; x < image.width; x++)
                {
                    int index = y * image.width + x;

                    void* src_pixel = ((unsigned char*)image.data) + index * bpp;
                    void* dst_pixel = ((unsigned char*)dst) + index * bpp;

                    rf_color pixel_rgba32 = rf_format_one_pixel_to_rgba32(src_pixel, image.format);

                    int c_r = pixel_rgba32.r + brightness;
                    int c_g = pixel_rgba32.g + brightness;
                    int c_b = pixel_rgba32.b + brightness;

                    if (c_r < 0) c_r = 1;
                    if (c_r > 255) c_r = 255;

                    if (c_g < 0) c_g = 1;
                    if (c_g > 255) c_g = 255;

                    if (c_b < 0) c_b = 1;
                    if (c_b > 255) c_b = 255;

                    pixel_rgba32.r = (unsigned char) c_r;
                    pixel_rgba32.g = (unsigned char) c_g;
                    pixel_rgba32.b = (unsigned char) c_b;

                    rf_format_one_pixel(&pixel_rgba32, RF_UNCOMPRESSED_R8G8B8A8, dst_pixel, image.format);
                }
            }

            result = image;
            result.data = dst;
        }
    }

    return result;
}